

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ConvolutionLayerParams::SerializeWithCachedSizes
          (ConvolutionLayerParams *this,CodedOutputStream *output)

{
  uint8 *puVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  unsigned_long *puVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  
  if (this->outputchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->outputchannels_,output);
  }
  if (this->kernelchannels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->kernelchannels_,output);
  }
  if (this->ngroups_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(10,this->ngroups_,output);
  }
  if (0 < (this->kernelsize_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0xa2);
      iVar4 = output->buffer_size_;
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xa2;
      puVar1[1] = '\x01';
      output->buffer_ = output->buffer_ + 2;
      iVar4 = output->buffer_size_ + -2;
      output->buffer_size_ = iVar4;
    }
    uVar13 = this->_kernelsize_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar13);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar8 = pbVar2;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar8 = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->kernelsize_).current_size_;
    if (0 < iVar4) {
      iVar12 = 0;
      do {
        puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->kernelsize_,iVar12);
        uVar11 = *puVar6;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar11);
        }
        else {
          pbVar2 = output->buffer_;
          pbVar8 = pbVar2;
          uVar10 = uVar11;
          if (0x7f < uVar11) {
            do {
              *pbVar8 = (byte)uVar11 | 0x80;
              uVar10 = uVar11 >> 7;
              pbVar8 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar10;
            } while (bVar3);
          }
          *pbVar8 = (byte)uVar10;
          iVar7 = ((int)pbVar8 - (int)pbVar2) + 1;
          output->buffer_ = output->buffer_ + iVar7;
          output->buffer_size_ = output->buffer_size_ - iVar7;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar4);
    }
  }
  if (0 < (this->stride_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0xf2);
      iVar4 = output->buffer_size_;
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xf2;
      puVar1[1] = '\x01';
      output->buffer_ = output->buffer_ + 2;
      iVar4 = output->buffer_size_ + -2;
      output->buffer_size_ = iVar4;
    }
    uVar13 = this->_stride_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar13);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar8 = pbVar2;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar8 = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->stride_).current_size_;
    if (0 < iVar4) {
      iVar12 = 0;
      do {
        puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->stride_,iVar12);
        uVar11 = *puVar6;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar11);
        }
        else {
          pbVar2 = output->buffer_;
          pbVar8 = pbVar2;
          uVar10 = uVar11;
          if (0x7f < uVar11) {
            do {
              *pbVar8 = (byte)uVar11 | 0x80;
              uVar10 = uVar11 >> 7;
              pbVar8 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar10;
            } while (bVar3);
          }
          *pbVar8 = (byte)uVar10;
          iVar7 = ((int)pbVar8 - (int)pbVar2) + 1;
          output->buffer_ = output->buffer_ + iVar7;
          output->buffer_size_ = output->buffer_size_ - iVar7;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar4);
    }
  }
  if (0 < (this->dilationfactor_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x142);
      iVar4 = output->buffer_size_;
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xc2;
      puVar1[1] = '\x02';
      output->buffer_ = output->buffer_ + 2;
      iVar4 = output->buffer_size_ + -2;
      output->buffer_size_ = iVar4;
    }
    uVar13 = this->_dilationfactor_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar13);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar8 = pbVar2;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar8 = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->dilationfactor_).current_size_;
    if (0 < iVar4) {
      iVar12 = 0;
      do {
        puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->dilationfactor_,iVar12);
        uVar11 = *puVar6;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar11);
        }
        else {
          pbVar2 = output->buffer_;
          pbVar8 = pbVar2;
          uVar10 = uVar11;
          if (0x7f < uVar11) {
            do {
              *pbVar8 = (byte)uVar11 | 0x80;
              uVar10 = uVar11 >> 7;
              pbVar8 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar10;
            } while (bVar3);
          }
          *pbVar8 = (byte)uVar10;
          iVar7 = ((int)pbVar8 - (int)pbVar2) + 1;
          output->buffer_ = output->buffer_ + iVar7;
          output->buffer_size_ = output->buffer_size_ - iVar7;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar4);
    }
  }
  uVar5 = this->_oneof_case_[0];
  if (uVar5 == 0x32) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x32,&((this->ConvolutionPaddingType_).valid_)->super_MessageLite,output);
    uVar5 = this->_oneof_case_[0];
  }
  if (uVar5 == 0x33) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x33,&((this->ConvolutionPaddingType_).valid_)->super_MessageLite,output);
  }
  if (this->isdeconvolution_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x3c,true,output);
  }
  if (this->hasbias_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0x46,true,output);
  }
  if (this->weights_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x5a,&this->weights_->super_MessageLite,output);
  }
  if (this->bias_ != (WeightParams *)0x0 &&
      this != (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x5b,&this->bias_->super_MessageLite,output);
  }
  if (0 < (this->outputshape_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x322);
      iVar4 = output->buffer_size_;
    }
    else {
      puVar1 = output->buffer_;
      puVar1[0] = 0xa2;
      puVar1[1] = '\x06';
      output->buffer_ = output->buffer_ + 2;
      iVar4 = output->buffer_size_ + -2;
      output->buffer_size_ = iVar4;
    }
    uVar13 = this->_outputshape_cached_byte_size_;
    if (iVar4 < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar13);
    }
    else {
      pbVar2 = output->buffer_;
      pbVar8 = pbVar2;
      uVar9 = uVar13;
      if (0x7f < uVar13) {
        do {
          *pbVar8 = (byte)uVar13 | 0x80;
          uVar9 = uVar13 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar3 = 0x3fff < uVar13;
          uVar13 = uVar9;
        } while (bVar3);
      }
      *pbVar8 = (byte)uVar9;
      iVar4 = ((int)pbVar8 - (int)pbVar2) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    iVar4 = (this->outputshape_).current_size_;
    if (0 < iVar4) {
      iVar12 = 0;
      do {
        puVar6 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->outputshape_,iVar12);
        uVar11 = *puVar6;
        if (output->buffer_size_ < 10) {
          google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar11);
        }
        else {
          pbVar2 = output->buffer_;
          pbVar8 = pbVar2;
          uVar10 = uVar11;
          if (0x7f < uVar11) {
            do {
              *pbVar8 = (byte)uVar11 | 0x80;
              uVar10 = uVar11 >> 7;
              pbVar8 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar10;
            } while (bVar3);
          }
          *pbVar8 = (byte)uVar10;
          iVar7 = ((int)pbVar8 - (int)pbVar2) + 1;
          output->buffer_ = output->buffer_ + iVar7;
          output->buffer_size_ = output->buffer_size_ - iVar7;
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 != iVar4);
    }
  }
  return;
}

Assistant:

void ConvolutionLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ConvolutionLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 outputChannels = 1;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->outputchannels(), output);
  }

  // uint64 kernelChannels = 2;
  if (this->kernelchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->kernelchannels(), output);
  }

  // uint64 nGroups = 10;
  if (this->ngroups() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(10, this->ngroups(), output);
  }

  // repeated uint64 kernelSize = 20;
  if (this->kernelsize_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(20, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_kernelsize_cached_byte_size_);
  }
  for (int i = 0, n = this->kernelsize_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->kernelsize(i), output);
  }

  // repeated uint64 stride = 30;
  if (this->stride_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(30, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_stride_cached_byte_size_);
  }
  for (int i = 0, n = this->stride_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->stride(i), output);
  }

  // repeated uint64 dilationFactor = 40;
  if (this->dilationfactor_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(40, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_dilationfactor_cached_byte_size_);
  }
  for (int i = 0, n = this->dilationfactor_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->dilationfactor(i), output);
  }

  // .CoreML.Specification.ValidPadding valid = 50;
  if (has_valid()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      50, *ConvolutionPaddingType_.valid_, output);
  }

  // .CoreML.Specification.SamePadding same = 51;
  if (has_same()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      51, *ConvolutionPaddingType_.same_, output);
  }

  // bool isDeconvolution = 60;
  if (this->isdeconvolution() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(60, this->isdeconvolution(), output);
  }

  // bool hasBias = 70;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(70, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 90;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      90, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 91;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      91, *this->bias_, output);
  }

  // repeated uint64 outputShape = 100;
  if (this->outputshape_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(100, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_outputshape_cached_byte_size_);
  }
  for (int i = 0, n = this->outputshape_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->outputshape(i), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ConvolutionLayerParams)
}